

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall cppnet::RWSocket::Close(RWSocket *this)

{
  shared_ptr<cppnet::Dispatcher> dispatcher;
  __shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (*(this->super_Socket)._vptr_Socket[10])();
  if (this->_timer_id != 0) {
    std::__shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,&(this->super_Socket)._dispatcher);
    if (local_20._M_ptr != (Dispatcher *)0x0) {
      Dispatcher::StopTimer(local_20._M_ptr,this->_timer_id);
    }
    this->_timer_id = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  return;
}

Assistant:

void RWSocket::Close() {
    Disconnect();
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}